

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QList<unsigned_short>_>::relocate
          (QArrayDataPointer<QList<unsigned_short>_> *this,qsizetype offset,
          QList<unsigned_short> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QList<unsigned_short>_> *in_RDI;
  QList<unsigned_short> **unaff_retaddr;
  QList<unsigned_short> *res;
  QList<unsigned_short> *first;
  QArrayDataPointer<QList<unsigned_short>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QList<unsigned_short>,long_long>
            (first,(longlong)in_RDI,(QList<unsigned_short> *)0xb81624);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QList<unsigned_short>>,QList<unsigned_short>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x18 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }